

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell-interface.h
# Opt level: O0

Literals * __thiscall
wasm::ShellExternalInterface::callTable
          (Literals *__return_storage_ptr__,ShellExternalInterface *this,Name tableName,
          Address index,HeapType sig,Literals *arguments,Type results,ModuleRunner *instance)

{
  size_t *this_00;
  Module *pMVar1;
  Name name;
  Function *pFVar2;
  bool bVar3;
  pointer ppVar4;
  address64_t aVar5;
  size_type sVar6;
  reference pvVar7;
  size_t sVar8;
  size_t sVar9;
  Literal *pLVar10;
  ulong uVar11;
  Name NVar12;
  Literals local_120;
  size_t local_e8;
  char *pcStack_e0;
  Type local_d0;
  uintptr_t local_c8;
  uintptr_t local_c0;
  uintptr_t *local_b8;
  Type *param;
  Iterator __end2;
  Iterator __begin2;
  Type *__range2;
  size_t i;
  string_view local_70;
  Function *local_60;
  Function *func;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> *table;
  _Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_true>
  local_48;
  iterator it;
  ShellExternalInterface *this_local;
  Type results_local;
  HeapType sig_local;
  Address index_local;
  Name tableName_local;
  
  index_local.addr = tableName.super_IString.str._M_len;
  this_local = (ShellExternalInterface *)results.id;
  it.
  super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_true>
             )(_Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_true>
               )this;
  results_local.id = sig.id;
  sig_local.id = index.addr;
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>_>_>
       ::find(&this->tables,(key_type *)&index_local);
  table = (vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
          std::
          unordered_map<wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>_>_>
          ::end(&this->tables);
  bVar3 = std::__detail::operator==
                    (&local_48,
                     (_Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_true>
                      *)&table);
  if (bVar3) {
    (*(this->super_ExternalInterface)._vptr_ExternalInterface[8])
              (this,"callTable on non-existing table");
  }
  ppVar4 = std::__detail::
           _Node_iterator<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_false,_true>
           ::operator->((_Node_iterator<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_false,_true>
                         *)&local_48);
  func = (Function *)&ppVar4->second;
  aVar5 = Address::operator_cast_to_unsigned_long((Address *)&sig_local);
  sVar6 = std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::size
                    ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)func);
  if (sVar6 <= aVar5) {
    (*(this->super_ExternalInterface)._vptr_ExternalInterface[8])(this,"callTable overflow");
  }
  pFVar2 = func;
  local_60 = (Function *)0x0;
  aVar5 = Address::operator_cast_to_unsigned_long((Address *)&sig_local);
  pvVar7 = std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::operator[]
                     ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)pFVar2,aVar5);
  bVar3 = wasm::Literal::isFunction(pvVar7);
  pFVar2 = func;
  if (bVar3) {
    aVar5 = Address::operator_cast_to_unsigned_long((Address *)&sig_local);
    pvVar7 = std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::operator[]
                       ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)pFVar2,aVar5);
    bVar3 = wasm::Literal::isNull(pvVar7);
    pFVar2 = func;
    if (!bVar3) {
      pMVar1 = (instance->super_ModuleRunnerBase<wasm::ModuleRunner>).wasm;
      aVar5 = Address::operator_cast_to_unsigned_long((Address *)&sig_local);
      pvVar7 = std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::operator[]
                         ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)pFVar2,aVar5);
      local_70 = (string_view)wasm::Literal::getFunc(pvVar7);
      NVar12.super_IString.str._M_str = (char *)local_70._M_len;
      NVar12.super_IString.str._M_len = (size_t)pMVar1;
      local_60 = (Function *)::wasm::Module::getFunctionOrNull(NVar12);
    }
  }
  if (local_60 == (Function *)0x0) {
    (*(this->super_ExternalInterface)._vptr_ExternalInterface[8])
              (this,"uninitialized table element");
  }
  bVar3 = HeapType::operator!=((HeapType *)&results_local,&local_60->type);
  if (bVar3) {
    (*(this->super_ExternalInterface)._vptr_ExternalInterface[8])
              (this,"callIndirect: function types don\'t match");
  }
  i = (size_t)Function::getParams(local_60);
  sVar8 = Type::size((Type *)&i);
  sVar9 = SmallVector<wasm::Literal,_1UL>::size(&arguments->super_SmallVector<wasm::Literal,_1UL>);
  if (sVar8 != sVar9) {
    (*(this->super_ExternalInterface)._vptr_ExternalInterface[8])
              (this,"callIndirect: bad # of arguments");
  }
  __range2 = (Type *)0x0;
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
       (size_t)Function::getParams(local_60);
  this_00 = &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
  join_0x00000010_0x00000000_ =
       (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)Type::begin((Type *)this_00);
  _param = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)Type::end((Type *)this_00)
  ;
  while (bVar3 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                           ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                            &__end2.
                             super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                                   &param), bVar3) {
    local_b8 = (uintptr_t *)
               ::wasm::Type::Iterator::operator*
                         ((Iterator *)
                          &__end2.
                           super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                         );
    pLVar10 = SmallVector<wasm::Literal,_1UL>::operator[]
                        (&arguments->super_SmallVector<wasm::Literal,_1UL>,(size_t)__range2);
    local_c0 = (pLVar10->type).id;
    local_c8 = *local_b8;
    uVar11 = ::wasm::Type::isSubType((Type)local_c0,(Type)local_c8);
    if ((uVar11 & 1) == 0) {
      (*(this->super_ExternalInterface)._vptr_ExternalInterface[8])
                (this,"callIndirect: bad argument type");
    }
    ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
              ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
               &__end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index);
    __range2 = (Type *)((long)&__range2->id + 1);
  }
  local_d0 = Function::getResults(local_60);
  bVar3 = Type::operator!=(&local_d0,(Type *)&this_local);
  if (bVar3) {
    (*(this->super_ExternalInterface)._vptr_ExternalInterface[8])
              (this,"callIndirect: bad result type");
  }
  bVar3 = Importable::imported(&local_60->super_Importable);
  if (bVar3) {
    (*(this->super_ExternalInterface)._vptr_ExternalInterface[4])
              (__return_storage_ptr__,this,local_60,arguments);
  }
  else {
    local_e8 = (local_60->super_Importable).super_Named.name.super_IString.str._M_len;
    pcStack_e0 = (local_60->super_Importable).super_Named.name.super_IString.str._M_str;
    Literals::Literals(&local_120,arguments);
    name.super_IString.str._M_str = pcStack_e0;
    name.super_IString.str._M_len = local_e8;
    ModuleRunnerBase<wasm::ModuleRunner>::callFunction
              (__return_storage_ptr__,&instance->super_ModuleRunnerBase<wasm::ModuleRunner>,name,
               &local_120);
    Literals::~Literals(&local_120);
  }
  return __return_storage_ptr__;
}

Assistant:

Literals callTable(Name tableName,
                     Address index,
                     HeapType sig,
                     Literals& arguments,
                     Type results,
                     ModuleRunner& instance) override {

    auto it = tables.find(tableName);
    if (it == tables.end()) {
      trap("callTable on non-existing table");
    }

    auto& table = it->second;
    if (index >= table.size()) {
      trap("callTable overflow");
    }
    Function* func = nullptr;
    if (table[index].isFunction() && !table[index].isNull()) {
      func = instance.wasm.getFunctionOrNull(table[index].getFunc());
    }
    if (!func) {
      trap("uninitialized table element");
    }
    if (sig != func->type) {
      trap("callIndirect: function types don't match");
    }
    if (func->getParams().size() != arguments.size()) {
      trap("callIndirect: bad # of arguments");
    }
    size_t i = 0;
    for (const auto& param : func->getParams()) {
      if (!Type::isSubType(arguments[i++].type, param)) {
        trap("callIndirect: bad argument type");
      }
    }
    if (func->getResults() != results) {
      trap("callIndirect: bad result type");
    }
    if (func->imported()) {
      return callImport(func, arguments);
    } else {
      return instance.callFunction(func->name, arguments);
    }
  }